

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_bf16.h
# Opt level: O0

void ncnn::cast_fp32_to_bf16_sse(Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  long lVar4;
  int iVar5;
  long *in_RSI;
  long *in_RDI;
  int i;
  unsigned_short *outptr;
  float *ptr;
  int q;
  int size;
  int elempack;
  int channels;
  int d;
  int h;
  int w;
  Mat *m;
  Mat *m_1;
  __m256i _v;
  __m256i _b;
  __m256i _a;
  __m128i _v_1;
  __m128i _b_1;
  __m128i _a_1;
  __m256i _ab;
  anon_union_4_2_947300b0 tmp;
  int local_59c;
  undefined1 (*local_550) [32];
  undefined1 (*local_4f0) [32];
  int local_4e4;
  
  lVar4 = in_RDI[7];
  iVar5 = *(int *)((long)in_RDI + 0x2c) * (int)in_RDI[6] * *(int *)((long)in_RDI + 0x34) *
          (int)in_RDI[3];
  for (local_4e4 = 0; local_4e4 < (int)lVar4; local_4e4 = local_4e4 + 1) {
    local_4f0 = (undefined1 (*) [32])(*in_RDI + in_RDI[8] * (long)local_4e4 * in_RDI[2]);
    local_550 = (undefined1 (*) [32])(*in_RSI + in_RSI[8] * (long)local_4e4 * in_RSI[2]);
    for (local_59c = 0; local_59c + 0xf < iVar5; local_59c = local_59c + 0x10) {
      auVar2 = vpsrld_avx2(*local_4f0,ZEXT416(0x10));
      auVar3 = vpsrld_avx2(local_4f0[1],ZEXT416(0x10));
      auVar2 = vpackusdw_avx2(auVar2,auVar3);
      auVar2 = vpermq_avx2(auVar2,0xd8);
      *local_550 = auVar2;
      local_4f0 = local_4f0 + 2;
      local_550 = local_550 + 1;
    }
    for (; local_59c + 7 < iVar5; local_59c = local_59c + 8) {
      auVar2 = vpsrld_avx2(*local_4f0,ZEXT416(0x10));
      auVar1 = vpackusdw_avx(auVar2._0_16_,auVar2._16_16_);
      *(undefined1 (*) [16])*local_550 = auVar1;
      local_4f0 = local_4f0 + 1;
      local_550 = (undefined1 (*) [32])(*local_550 + 0x10);
    }
    for (; local_59c < iVar5; local_59c = local_59c + 1) {
      *(short *)*local_550 = (short)((uint)*(undefined4 *)*local_4f0 >> 0x10);
      local_550 = (undefined1 (*) [32])(*local_550 + 2);
      local_4f0 = (undefined1 (*) [32])(*local_4f0 + 4);
    }
  }
  return;
}

Assistant:

static void cast_fp32_to_bf16_sse(const Mat& bottom_blob, Mat& top_blob, const Option& opt)
{
#if NCNN_RUNTIME_CPU && NCNN_AVX512BF16 && __AVX512F__ && !__AVX512BF16__
    if (ncnn::cpu_support_x86_avx512_bf16())
    {
        cast_fp32_to_bf16_sse_avx512bf16(bottom_blob, top_blob, opt);
        return;
    }
#endif

#if NCNN_RUNTIME_CPU && NCNN_AVX2 && __AVX__ && !__AVX2__ && !__AVX512BF16__
    if (ncnn::cpu_support_x86_avx2())
    {
        cast_fp32_to_bf16_sse_avx2(bottom_blob, top_blob, opt);
        return;
    }
#endif

    const int w = bottom_blob.w;
    const int h = bottom_blob.h;
    const int d = bottom_blob.d;
    const int channels = bottom_blob.c;
    const int elempack = bottom_blob.elempack;

    const int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* ptr = bottom_blob.channel(q);
        unsigned short* outptr = top_blob.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 31 < size; i += 32)
        {
            _mm512_storeu_si512((__m512i*)outptr, float2bfloat_avx512(_mm512_loadu_ps(ptr), _mm512_loadu_ps(ptr + 16)));
            ptr += 32;
            outptr += 32;
        }
#endif // __AVX512F__
        for (; i + 15 < size; i += 16)
        {
#if __AVX512F__
            _mm256_storeu_si256((__m256i*)outptr, float2bfloat_avx512(_mm512_loadu_ps(ptr)));
#else
            _mm256_storeu_si256((__m256i*)outptr, float2bfloat_avx(_mm256_loadu_ps(ptr), _mm256_loadu_ps(ptr + 8)));
#endif
            ptr += 16;
            outptr += 16;
        }
#endif // __AVX__
        for (; i + 7 < size; i += 8)
        {
#if __AVX__
            _mm_store_si128((__m128i*)outptr, float2bfloat_avx(_mm256_loadu_ps(ptr)));
#else
            _mm_store_si128((__m128i*)outptr, float2bfloat_sse(_mm_loadu_ps(ptr), _mm_loadu_ps(ptr + 4)));
#endif
            ptr += 8;
            outptr += 8;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *outptr++ = float32_to_bfloat16(*ptr++);
        }
    }
}